

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMAttrImpl::setValue(DOMAttrImpl *this,XMLCh *val)

{
  unsigned_short *puVar1;
  ushort uVar2;
  DOMDocument *pDVar3;
  int iVar4;
  long *plVar5;
  undefined4 extraout_var_00;
  DOMException *this_00;
  undefined4 extraout_var_01;
  undefined8 *puVar6;
  undefined4 extraout_var_02;
  DOMNode *pDVar7;
  undefined4 extraout_var;
  
  uVar2 = (this->fNode).flags;
  if ((uVar2 & 1) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_01,iVar4) == 0) {
      puVar6 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar6 = (undefined8 *)(CONCAT44(extraout_var_02,iVar4) + 0x158);
    }
    DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar6);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar3 = (this->fParent).fOwnerDocument;
  pDVar7 = &pDVar3[-1].super_DOMNode;
  if (pDVar3 == (DOMDocument *)0x0) {
    pDVar7 = (DOMNode *)0x0;
  }
  if ((uVar2 & 0x100) != 0) {
    DOMNodeIDMap::remove(*(DOMNodeIDMap **)(pDVar7 + 0x10),(char *)this);
  }
  while ((this->fParent).fFirstChild != (DOMNode *)0x0) {
    iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x10])(this);
    plVar5 = (long *)CONCAT44(extraout_var,iVar4);
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x138))(plVar5);
    }
  }
  if (val != (XMLCh *)0x0) {
    iVar4 = (*pDVar7->_vptr_DOMNode[0x3e])(pDVar7,val);
    DOMParentNode::appendChildFast(&this->fParent,(DOMNode *)CONCAT44(extraout_var_00,iVar4));
  }
  puVar1 = &(this->fNode).flags;
  *puVar1 = *puVar1 | 0x20;
  DOMParentNode::changed(&this->fParent);
  if (((this->fNode).flags & 0x100) != 0) {
    DOMNodeIDMap::add(*(DOMNodeIDMap **)(pDVar7 + 0x10),&this->super_DOMAttr);
    return;
  }
  return;
}

Assistant:

void DOMAttrImpl::setValue(const XMLCh *val)
{
    if (fNode.isReadOnly())
    {
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    }

    //  If this attribute was of type ID and in the map, take it out,
    //    then put it back in with the new name.  For now, we don't worry
    //    about what happens if the new name conflicts
    //
    DOMDocumentImpl *doc = (DOMDocumentImpl *)fParent.fOwnerDocument;
    if (fNode.isIdAttr())
        doc->getNodeIDMap()->remove(this);

    DOMNode *kid;
    while ((kid = fParent.fFirstChild) != 0)         // Remove existing kids
    {
        DOMNode* node = removeChild(kid);
        if (node)
            node->release();
    }

    if (val != 0)              // Create and add the new one
        fParent.appendChildFast(doc->createTextNode(val));
    fNode.isSpecified(true);
    fParent.changed();

    if (fNode.isIdAttr())
        doc->getNodeIDMap()->add(this);

}